

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::submit::render_value(submit *this,form_context *context)

{
  ostream *poVar1;
  streamable *obj;
  escape *in_RDI;
  escape *in_stack_ffffffffffffff78;
  escape *this_00;
  basic_message<char> *in_stack_ffffffffffffff98;
  streamable *in_stack_ffffffffffffffa0;
  form_context *in_stack_ffffffffffffffc0;
  
  poVar1 = form_context::out(in_stack_ffffffffffffffc0);
  obj = (streamable *)std::operator<<(poVar1,"value=\"");
  this_00 = (escape *)&stack0xffffffffffffffa8;
  filters::streamable::streamable<booster::locale::basic_message<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  filters::escape::escape(this_00,obj);
  poVar1 = filters::operator<<((ostream *)in_RDI,in_stack_ffffffffffffff78);
  std::operator<<(poVar1,"\" ");
  filters::escape::~escape(in_RDI);
  filters::streamable::~streamable((streamable *)&stack0xffffffffffffffa8);
  return;
}

Assistant:

void submit::render_value(form_context &context)
{
	context.out() << "value=\"" << filters::escape(value_) << "\" ";
}